

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLog::WriteCreateIndex(WriteAheadLog *this,IndexCatalogEntry *entry)

{
  BinarySerializer *this_00;
  DataTableInfo *pDVar1;
  WriteAheadLogSerializer serializer;
  WriteAheadLogSerializer WStack_5c8;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&WStack_5c8,this,CREATE_INDEX);
  this_00 = &WStack_5c8.serializer;
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"index_catalog_entry");
  Serializer::WriteValue<duckdb::IndexCatalogEntry>(&this_00->super_Serializer,entry);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  pDVar1 = DuckIndexEntry::GetDataTableInfo((DuckIndexEntry *)entry);
  SerializeIndex(this->database,&WStack_5c8,&pDVar1->indexes,
                 &(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&WStack_5c8.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&WStack_5c8);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateIndex(const IndexCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_INDEX);
	serializer.WriteProperty(101, "index_catalog_entry", &entry);

	// Serialize the index data to the persistent storage and write the metadata.
	auto &index_entry = entry.Cast<DuckIndexEntry>();
	auto &list = index_entry.GetDataTableInfo().GetIndexes();
	SerializeIndex(database, serializer, list, index_entry.name);
	serializer.End();
}